

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,COpExp *expression)

{
  IExpression *pIVar1;
  TOperationType _operation;
  CBinopExpression *this_00;
  ISubtreeWrapper *_wrapper;
  CBuildVisitor *this_01;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_50;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_40;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_38;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperRight;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> wrapperLeft;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: COpExp\n");
  pIVar1 = (expression->leftOperand)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
  wrapperLeft._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
       )(this->wrapper)._M_t.
        super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t
        .super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
        super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  this_01 = (CBuildVisitor *)
            (expression->rightOperand)._M_t.
            super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
            super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
            super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(((PositionedNode *)&this_01->super_IVisitor)->super_INode)._vptr_INode)(this_01,this);
  wrapperRight._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
       )(this->wrapper)._M_t.
        super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t
        .super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
        super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  _operation = operatorAst2Irt(this_01,expression->operation);
  this_00 = (CBinopExpression *)operator_new(0x20);
  (*(code *)**(undefined8 **)
              wrapperLeft._M_t.
              super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
              ._M_t.
              super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
              .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)(&local_38);
  local_50._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (CExpression *)0x0;
  (*(code *)**(undefined8 **)
              wrapperRight._M_t.
              super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
              ._M_t.
              super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
              .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)(&local_48);
  local_40._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (CExpression *)0x0;
  IRT::CBinopExpression::CBinopExpression
            (this_00,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&local_50,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &local_40,_operation);
  if (local_40._M_head_impl != (CExpression *)0x0) {
    (*((local_40._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_40._M_head_impl = (CExpression *)0x0;
  if (local_48._M_head_impl != (CExpression *)0x0) {
    (*((local_48._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  if (local_50._M_head_impl != (CExpression *)0x0) {
    (*((local_50._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  local_50._M_head_impl = (CExpression *)0x0;
  if (local_38._M_head_impl != (CExpression *)0x0) {
    (*((local_38._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
  }
  _wrapper = (ISubtreeWrapper *)operator_new(0x10);
  _wrapper->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b478;
  _wrapper[1]._vptr_ISubtreeWrapper = (_func_int **)this_00;
  updateSubtreeWrapper(this,_wrapper);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&wrapperRight);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&wrapperLeft);
  return;
}

Assistant:

void CBuildVisitor::Visit( COpExp &expression ) {
    std::cout << "IRT builder: COpExp\n";
    expression.leftOperand->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperLeft = std::move( wrapper );

    expression.rightOperand->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> wrapperRight = std::move( wrapper );

    IRT::enums::TOperationType operatorType = operatorAst2Irt( expression.operation );

    std::unique_ptr<const IRT::CExpression> binOpPtr = std::unique_ptr<const IRT::CExpression>(
            new IRT::CBinopExpression(
                    std::move( wrapperLeft->ToExpression( )),
                    std::move( wrapperRight->ToExpression( )),
                    operatorType ));
    updateSubtreeWrapper( new IRT::CExpressionWrapper( std::move( binOpPtr )));
}